

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printStatistics(Instance *instance)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = Instance::solve(instance);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SAT",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"VSS: ",5);
    Instance::num_vss(instance);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MAKESPAN: ",10);
    Instance::makespan(instance);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sum Times: ",0xb);
    Instance::sum_times(instance);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  else {
    poVar2 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UNSAT",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CONSTRAINT TIME: ",0x11)
  ;
  poVar2 = std::ostream::_M_insert<double>(instance->constraint_t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SOLVE TIME: ",0xc);
  poVar2 = std::ostream::_M_insert<double>(instance->solve_t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void printStatistics(Instance* instance) {
  if(instance->solve()) {
    std::cout << "SAT" << "\n";
    std::cout << "VSS: " << instance->num_vss() << "\n";
    std::cout << "MAKESPAN: " << instance->makespan() << "\n";
    std::cout << "Sum Times: " << instance->sum_times() << "\n";

  } else {
    std::cout << "UNSAT" << "\n";
  }
  std::cout << "CONSTRAINT TIME: " << instance->constraint_t << "\n";
  std::cout << "SOLVE TIME: " << instance->solve_t << "\n";
}